

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FixVariablePS::FixVariablePS(FixVariablePS *this,FixVariablePS *old)

{
  double dVar1;
  int iVar2;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FixVariablePS_0053e7d8;
  iVar2 = old->m_old_j;
  this->m_j = old->m_j;
  this->m_old_j = iVar2;
  dVar1 = old->m_obj;
  this->m_val = old->m_val;
  this->m_obj = dVar1;
  dVar1 = old->m_upper;
  this->m_lower = old->m_lower;
  this->m_upper = dVar1;
  this->m_correctIdx = old->m_correctIdx;
  DSVectorBase<double>::DSVectorBase(&this->m_col,&old->m_col);
  return;
}

Assistant:

FixVariablePS(const FixVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_val(old.m_val)
         , m_obj(old.m_obj)
         , m_lower(old.m_lower)
         , m_upper(old.m_upper)
         , m_correctIdx(old.m_correctIdx)
         , m_col(old.m_col)
      {}